

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::pop
          (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar4;
  UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this_local;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  
  do {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>>::pop() [T = std::pair<wasm::LocalGraphFlower::FlowBlock *, unsigned int>]"
                   );
    }
    pvVar2 = std::
             queue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>_>
             ::front(&this->data);
    this_local = (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  *)pvVar2->first;
    item.first._0_4_ = (undefined4)*(undefined8 *)&pvVar2->second;
    item.first._4_4_ = (undefined4)((ulong)*(undefined8 *)&pvVar2->second >> 0x20);
    pmVar3 = std::
             unordered_map<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
    *pmVar3 = *pmVar3 - 1;
    std::
    queue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>_>
    ::pop(&this->data);
    pmVar3 = std::
             unordered_map<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>_>
             ::operator[](&this->count,(key_type *)&this_local);
  } while (*pmVar3 != 0);
  pVar4.second = item.first._0_4_;
  pVar4.first = (FlowBlock *)this_local;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }